

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertexInt<signed_char>
               (vector<signed_char,_std::allocator<signed_char>_> *src,
               vector<signed_char,_std::allocator<signed_char>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  uint uVar1;
  mapped_type mVar2;
  pointer puVar3;
  _Hash_node_base *p_Var4;
  pointer puVar5;
  mapped_type *pmVar6;
  __node_base _Var7;
  __hash_code __code;
  bool bVar8;
  ulong uVar9;
  uint uVar10;
  size_type __new_size;
  uint32_t vidx;
  unordered_map<unsigned_int,_signed_char,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>_>
  vdata;
  uint local_6c;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst != (vector<signed_char,_std::allocator<signed_char>_> *)0x0) {
    puVar5 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = (long)puVar3 - (long)puVar5 >> 2;
    if (2 < uVar9 &&
        (long)(src->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(src->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
              super__Vector_impl_data._M_start == uVar9) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      if (puVar3 == puVar5) {
        __new_size = 1;
      }
      else {
        uVar9 = 0;
        uVar10 = 0;
        do {
          local_6c = puVar5[uVar9];
          if (uVar10 < local_6c) {
            uVar10 = local_6c;
          }
          if (local_68._M_buckets[(ulong)local_6c % local_68._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var4 = local_68._M_buckets[(ulong)local_6c % local_68._M_bucket_count]->_M_nxt;
            uVar1 = *(uint *)&p_Var4[1]._M_nxt;
            do {
              if (local_6c == uVar1) {
                pmVar6 = ::std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_6c);
                if (*pmVar6 ==
                    (src->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar9]) goto LAB_00377440;
                bVar8 = false;
                goto LAB_0037749d;
              }
              p_Var4 = p_Var4->_M_nxt;
            } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                    (uVar1 = *(uint *)&p_Var4[1]._M_nxt,
                    (ulong)uVar1 % local_68._M_bucket_count ==
                    (ulong)local_6c % local_68._M_bucket_count));
          }
          mVar2 = (src->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar9];
          pmVar6 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,&local_6c);
          *pmVar6 = mVar2;
LAB_00377440:
          uVar9 = uVar9 + 1;
          puVar5 = (faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(faceVertexIndices->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >>
                                2));
        __new_size = (size_type)(uVar10 + 1);
      }
      ::std::vector<signed_char,_std::allocator<signed_char>_>::resize(dst,__new_size);
      memset((dst->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start,0,__new_size);
      bVar8 = true;
      for (_Var7._M_nxt = local_68._M_before_begin._M_nxt; _Var7._M_nxt != (_Hash_node_base *)0x0;
          _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt) {
        (dst->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
        super__Vector_impl_data._M_start[*(uint *)&_Var7._M_nxt[1]._M_nxt] =
             *(char *)((long)&_Var7._M_nxt[1]._M_nxt + 4);
      }
LAB_0037749d:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool TryConvertFacevaryingToVertexInt(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}